

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::StreamExpressionWithRangeSyntax::setChild
          (StreamExpressionWithRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  ElementSelectSyntax *pEVar2;
  Token TVar3;
  
  if (index == 0) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->withKeyword).kind = TVar3.kind;
    (this->withKeyword).field_0x2 = TVar3._2_1_;
    (this->withKeyword).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->withKeyword).rawLen = TVar3.rawLen;
    (this->withKeyword).info = TVar3.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pEVar2 = (ElementSelectSyntax *)0x0;
    }
    else {
      pEVar2 = (ElementSelectSyntax *)TokenOrSyntax::node(&child);
    }
    (this->range).ptr = pEVar2;
  }
  return;
}

Assistant:

void StreamExpressionWithRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: withKeyword = child.token(); return;
        case 1: range = child.node() ? &child.node()->as<ElementSelectSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}